

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

bool __thiscall
soul::heart::Parser::parseStatement(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char (*args_00) [2];
  string *this_00;
  string name;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [32];
  CodeLocation local_a8;
  CompileMessage local_98;
  CompileMessage local_60;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"let");
  if (bVar1) {
    readVariableIdentifier_abi_cxx11_((string *)local_100,this);
    findVariable((Parser *)local_e0,(FunctionParseState *)this,(string *)state);
    if (local_e0 != (undefined1  [8])0x0) {
      Errors::nameInUse<std::__cxx11::string&>((CompileMessage *)local_e0,(Errors *)local_100,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,local_e0);
      CompileMessage::~CompileMessage((CompileMessage *)local_e0);
    }
    local_e0 = (undefined1  [8])0x0;
    std::__cxx11::string::string((string *)&local_d8,(string *)local_100);
    local_c8[0x10] = true;
    local_c8[0x11] = false;
    parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_e0);
LAB_002791b6:
    std::__cxx11::string::~string((string *)&local_d8);
    this_00 = (string *)local_100;
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"write");
    if (bVar1) {
      bVar1 = parseWriteStream(this,state,builder);
      return bVar1;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"advance");
    if (bVar1) {
      if ((state->function->functionType).type == run) {
        expectSemicolon(this);
        local_a8.sourceCode.object =
             (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.sourceCode.object;
        if (local_a8.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_a8.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_a8.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_a8.location.data =
             (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
        BlockBuilder::createStatement<soul::heart::AdvanceClock,soul::CodeLocation>
                  (&builder->super_BlockBuilder,(CodeLocation *)(local_c8 + 0x20));
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                  ((RefCountedPtr<soul::SourceCodeText> *)(local_c8 + 0x20));
        return true;
      }
      Errors::advanceCannotBeCalledHere<>();
      CodeLocation::throwError
                (&(this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).location,&local_60);
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"call");
    if (bVar1) {
      local_e0 = (undefined1  [8])0x0;
      local_d8._M_p = local_c8;
      local_d0 = (undefined1  [8])0x0;
      local_c8[0] = '\0';
      local_c8[0x10] = false;
      local_c8[0x11] = true;
      parseFunctionCall(this,state,builder,(AssignmentTarget *)local_e0);
    }
    else {
      bVar1 = matchesAnyIdentifier(this);
      if (!bVar1) {
        return false;
      }
      parseVariableExpression((Parser *)local_100,(FunctionParseState *)this);
      if ((pointer)local_100._0_8_ == (pointer)0x0) {
        readVariableIdentifier_abi_cxx11_((string *)local_100,this);
        local_e0 = (undefined1  [8])0x0;
        std::__cxx11::string::string((string *)&local_d8,(string *)local_100);
        local_c8[0x10] = false;
        local_c8[0x11] = false;
        parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_e0);
        goto LAB_002791b6;
      }
      pEVar3 = pool_ptr<soul::heart::Expression>::operator->
                         ((pool_ptr<soul::heart::Expression> *)local_100);
      iVar2 = (*(pEVar3->super_Object)._vptr_Object[8])(pEVar3);
      if ((char)iVar2 == '\0') {
        Errors::operatorNeedsAssignableTarget<char_const(&)[2]>
                  ((CompileMessage *)(local_c8 + 0x30),(Errors *)0x2a3521,args_00);
        CodeLocation::throwError
                  (&(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location,(CompileMessage *)(local_c8 + 0x30));
      }
      local_e0 = (undefined1  [8])local_100._0_8_;
      local_d8._M_p = local_c8;
      local_d0 = (undefined1  [8])0x0;
      local_c8[0] = '\0';
      local_c8[0x10] = false;
      local_c8[0x11] = false;
      parseVariableAssignment(this,state,builder,(AssignmentTarget *)local_e0);
    }
    this_00 = (string *)&local_d8;
  }
  std::__cxx11::string::~string(this_00);
  return true;
}

Assistant:

bool parseStatement (FunctionParseState& state, FunctionBuilder& builder)
    {
        if (matchIf ("let"))
        {
            auto name = readVariableIdentifier();

            if (findVariable (state, name) != nullptr)
                throwError (Errors::nameInUse (name));

            parseVariableAssignment (state, builder, { nullptr, name, true, false });
            return true;
        }

        if (matchIf ("write"))
            return parseWriteStream (state, builder);

        if (matchIf ("advance"))
        {
            if (! state.function.functionType.isRun())
                location.throwError (Errors::advanceCannotBeCalledHere());

            expectSemicolon();
            builder.addAdvance (location);
            return true;
        }

        if (matchIf ("call"))
        {
            parseFunctionCall (state, builder, { nullptr, {}, false, true });
            return true;
        }

        if (matchesAnyIdentifier())
        {
            if (auto existingVariableTarget = parseVariableExpression (state))
            {
                if (! existingVariableTarget->isMutable())
                    location.throwError (Errors::operatorNeedsAssignableTarget ("="));

                parseVariableAssignment (state, builder, { existingVariableTarget, {}, false, false });
                return true;
            }

            auto newVariableName = readVariableIdentifier();
            parseVariableAssignment (state, builder, { nullptr, newVariableName, false, false });
            return true;
        }

        return false;
    }